

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

bool isFatalCountDown(char *varname,QBasicAtomicInt *n)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  bool bVar4;
  bool local_39;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (n->_q_value).super___atomic_base<int>._M_i;
  if (iVar1 == 0) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
    qgetenv((QByteArray *)&local_38,varname);
    if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
      QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    }
    else {
      local_39 = true;
      iVar2 = QByteArray::toInt((QByteArray *)&local_38,&local_39,0);
      bVar3 = local_39;
      QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
      bVar4 = true;
      if (((iVar2 < 0) || (bVar3 == false)) || (iVar2 == 1)) goto LAB_00201c75;
      if (iVar2 != 0) {
        bVar4 = false;
        LOCK();
        iVar1 = (n->_q_value).super___atomic_base<int>._M_i;
        bVar3 = iVar1 == 0;
        if (bVar3) {
          (n->_q_value).super___atomic_base<int>._M_i = iVar2;
          iVar1 = 0;
        }
        UNLOCK();
        if (bVar3) goto LAB_00201c75;
        goto LAB_00201bcd;
      }
    }
    (n->_q_value).super___atomic_base<int>._M_i = 1;
    bVar4 = false;
  }
  else {
LAB_00201bcd:
    do {
      if (iVar1 < 3) break;
      LOCK();
      iVar2 = (n->_q_value).super___atomic_base<int>._M_i;
      bVar3 = iVar1 == iVar2;
      if (bVar3) {
        (n->_q_value).super___atomic_base<int>._M_i = iVar1 + -1;
        iVar2 = iVar1;
      }
      iVar1 = iVar2;
      UNLOCK();
    } while (!bVar3);
    bVar4 = iVar1 == 2;
  }
LAB_00201c75:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

static bool isFatalCountDown(const char *varname, QBasicAtomicInt &n)
{
    static const int Uninitialized = 0;
    static const int NeverFatal = 1;
    static const int ImmediatelyFatal = 2;

    int v = n.loadRelaxed();
    if (v == Uninitialized) {
        // first, initialize from the environment
        // note that the atomic stores the env.var value plus 1, so adjust
        const int env = checked_var_value(varname) + 1;
        if (env == NeverFatal) {
            // not fatal, now or in the future, so use a fast path
            n.storeRelaxed(NeverFatal);
            return false;
        } else if (env == ImmediatelyFatal) {
            return true;
        } else if (n.testAndSetRelaxed(Uninitialized, env - 1, v)) {
            return false;       // not yet fatal, but decrement
        } else {
            // some other thread initialized before we did
        }
    }

    while (v > ImmediatelyFatal && !n.testAndSetRelaxed(v, v - 1, v))
        qYieldCpu();

    // We exited the loop, so either v already was ImmediatelyFatal or we
    // succeeded to set n from v to v-1.
    return v == ImmediatelyFatal;
}